

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::getEnterVals
          (SPxSolverBase<double> *this,SPxId enterId,double *enterTest,double *enterUB,
          double *enterLB,double *enterVal,double *enterMax,double *enterPric,Status *enterStat,
          double *enterRO,StableSum<double> *objChange)

{
  bool bVar1;
  Representation RVar2;
  Status *pSVar3;
  double *pdVar4;
  undefined8 uVar5;
  double *in_RCX;
  double *in_RDX;
  SPxSolverBase<double> *in_RDI;
  double *in_R8;
  double *in_R9;
  double dVar6;
  double *in_stack_00000008;
  double *in_stack_00000010;
  Desc *in_stack_00000018;
  double *in_stack_00000020;
  StableSum<double> *in_stack_00000028;
  Desc *ds;
  int enterIdx;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  SPxLPBase<double> *in_stack_fffffffffffffe30;
  SPxSolverBase<double> *in_stack_fffffffffffffe38;
  SPxSolverBase<double> *in_stack_fffffffffffffe40;
  allocator *paVar7;
  double local_1a0;
  double local_120;
  allocator local_d1;
  string local_d0 [38];
  undefined1 local_aa;
  allocator local_a9;
  string local_a8 [32];
  SPxRowId local_88;
  undefined1 local_7d;
  allocator local_69;
  string local_68 [32];
  SPxColId local_48;
  Desc *local_40;
  int local_34;
  double *local_30;
  double *local_28;
  double *local_20;
  double *local_18;
  SPxId local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_40 = SPxBasisBase<double>::desc(&in_RDI->super_SPxBasisBase<double>);
  bVar1 = SPxId::isSPxColId(&local_8);
  if (bVar1) {
    SPxColId::SPxColId(&local_48,&local_8);
    local_34 = SPxLPBase<double>::number
                         (in_stack_fffffffffffffe30,
                          (SPxColId *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28))
    ;
    pSVar3 = SPxBasisBase<double>::Desc::colStatus
                       ((Desc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
    (in_stack_00000018->rowstat).thesize = *pSVar3;
    RVar2 = rep(in_RDI);
    if (RVar2 == COLUMN) {
      computePvec(in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
      dVar6 = computeTest(in_stack_fffffffffffffe38,(int)((ulong)in_stack_fffffffffffffe30 >> 0x20))
      ;
      *local_18 = dVar6;
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *pdVar4 = 0.0;
    }
    else {
      coTest(in_RDI);
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *local_18 = *pdVar4;
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *pdVar4 = 0.0;
    }
    switch((in_stack_00000018->rowstat).thesize) {
    case 1:
      pdVar4 = (double *)infinity();
      *local_20 = *pdVar4;
      pdVar4 = (double *)infinity();
      *local_28 = -*pdVar4;
      *local_30 = 0.0;
      pdVar4 = SPxLPBase<double>::upper(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      *in_stack_00000020 = *pdVar4;
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *in_stack_00000010 = *pdVar4;
      if (*in_stack_00000010 < *in_stack_00000020 || *in_stack_00000010 == *in_stack_00000020) {
        pdVar4 = (double *)infinity();
        *in_stack_00000008 = -*pdVar4;
      }
      else {
        pdVar4 = (double *)infinity();
        *in_stack_00000008 = *pdVar4;
      }
      pSVar3 = SPxBasisBase<double>::Desc::colStatus
                         ((Desc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      *pSVar3 = P_FIXED;
      break;
    case 2:
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *local_20 = *pdVar4;
      pdVar4 = (double *)infinity();
      *local_28 = -*pdVar4;
      pdVar4 = (double *)infinity();
      *in_stack_00000008 = -*pdVar4;
      *local_30 = *local_20;
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *in_stack_00000010 = *pdVar4;
      pdVar4 = SPxLPBase<double>::lower(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      *in_stack_00000020 = *pdVar4;
      StableSum<double>::operator-=
                ((StableSum<double> *)in_stack_fffffffffffffe30,
                 (double)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      pSVar3 = SPxBasisBase<double>::Desc::colStatus
                         ((Desc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      *pSVar3 = P_ON_LOWER;
      break;
    case 4:
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *local_28 = *pdVar4;
      pdVar4 = (double *)infinity();
      *local_20 = *pdVar4;
      pdVar4 = (double *)infinity();
      *in_stack_00000008 = *pdVar4;
      *local_30 = *local_28;
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *in_stack_00000010 = *pdVar4;
      pdVar4 = SPxLPBase<double>::upper(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      *in_stack_00000020 = *pdVar4;
      StableSum<double>::operator-=
                ((StableSum<double> *)in_stack_fffffffffffffe30,
                 (double)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      pSVar3 = SPxBasisBase<double>::Desc::colStatus
                         ((Desc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      *pSVar3 = P_ON_UPPER;
      break;
    case 6:
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *in_stack_00000010 = *pdVar4;
      dVar6 = *in_stack_00000010;
      pdVar4 = SPxLPBase<double>::upper(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      if (dVar6 < *pdVar4 || dVar6 == *pdVar4) {
        pdVar4 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffe30,
                            in_stack_fffffffffffffe2c);
        *local_20 = *pdVar4;
        *local_30 = *local_20;
        pdVar4 = SPxLPBase<double>::lower(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
        *in_stack_00000020 = *pdVar4;
        pdVar4 = (double *)infinity();
        *local_28 = -*pdVar4;
        pdVar4 = (double *)infinity();
        *in_stack_00000008 = -*pdVar4;
        pSVar3 = SPxBasisBase<double>::Desc::colStatus
                           ((Desc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
        *pSVar3 = P_ON_LOWER;
      }
      else {
        pdVar4 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffe30,
                            in_stack_fffffffffffffe2c);
        *local_28 = *pdVar4;
        pdVar4 = (double *)infinity();
        *local_20 = *pdVar4;
        pdVar4 = (double *)infinity();
        *in_stack_00000008 = *pdVar4;
        *local_30 = *local_28;
        pdVar4 = SPxLPBase<double>::upper(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
        *in_stack_00000020 = *pdVar4;
        pSVar3 = SPxBasisBase<double>::Desc::colStatus
                           ((Desc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
        *pSVar3 = P_ON_UPPER;
      }
      VectorBase<double>::operator[]
                ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      SPxLPBase<double>::upper(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      StableSum<double>::operator-=
                ((StableSum<double> *)in_stack_fffffffffffffe30,
                 (double)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      VectorBase<double>::operator[]
                ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      SPxLPBase<double>::lower(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      StableSum<double>::operator-=
                ((StableSum<double> *)in_stack_fffffffffffffe30,
                 (double)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      break;
    case -4:
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *local_20 = *pdVar4;
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *local_28 = *pdVar4;
      *local_30 = *local_28;
      *in_stack_00000008 = *local_20 - *local_28;
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *in_stack_00000010 = *pdVar4;
      pdVar4 = SPxLPBase<double>::maxObj(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      *in_stack_00000020 = *pdVar4;
      StableSum<double>::operator-=
                ((StableSum<double> *)in_stack_fffffffffffffe30,
                 (double)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      dVar6 = *local_20;
      pdVar4 = (double *)infinity();
      if (dVar6 < *pdVar4) {
        epsilon((SPxSolverBase<double> *)0x258842);
        bVar1 = EQ<double,double,double>
                          ((double)in_stack_fffffffffffffe30,
                           (double)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                           1.21527303170155e-317);
        if (bVar1) {
          pSVar3 = SPxBasisBase<double>::Desc::colStatus
                             ((Desc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
          *pSVar3 = D_FREE;
        }
        else {
          pSVar3 = SPxBasisBase<double>::Desc::colStatus
                             ((Desc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
          *pSVar3 = D_ON_BOTH;
        }
      }
      else {
        pSVar3 = SPxBasisBase<double>::Desc::colStatus
                           ((Desc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
        *pSVar3 = D_ON_UPPER;
      }
      break;
    default:
      local_7d = 1;
      uVar5 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"XENTER01 This should never happen.",&local_69);
      SPxInternalCodeException::SPxInternalCodeException
                ((SPxInternalCodeException *)in_stack_fffffffffffffe30,
                 (string *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      local_7d = 0;
      __cxa_throw(uVar5,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    case -2:
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *local_20 = *pdVar4;
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *local_28 = *pdVar4;
      *local_30 = *local_20;
      *in_stack_00000008 = *local_28 - *local_20;
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *in_stack_00000010 = *pdVar4;
      pdVar4 = SPxLPBase<double>::maxObj(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      *in_stack_00000020 = *pdVar4;
      StableSum<double>::operator-=
                ((StableSum<double> *)in_stack_fffffffffffffe30,
                 (double)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      dVar6 = *local_28;
      pdVar4 = (double *)infinity();
      if (-*pdVar4 < dVar6) {
        epsilon((SPxSolverBase<double> *)0x25865d);
        bVar1 = EQ<double,double,double>
                          ((double)in_stack_fffffffffffffe30,
                           (double)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                           1.21503340986331e-317);
        if (bVar1) {
          pSVar3 = SPxBasisBase<double>::Desc::colStatus
                             ((Desc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
          *pSVar3 = D_FREE;
        }
        else {
          pSVar3 = SPxBasisBase<double>::Desc::colStatus
                             ((Desc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
          *pSVar3 = D_ON_BOTH;
        }
      }
      else {
        pSVar3 = SPxBasisBase<double>::Desc::colStatus
                           ((Desc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
        *pSVar3 = D_ON_LOWER;
      }
      break;
    case -1:
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *local_20 = *pdVar4;
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *local_28 = *pdVar4;
      *local_30 = 0.0;
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *in_stack_00000010 = *pdVar4;
      pdVar4 = SPxLPBase<double>::maxObj(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      *in_stack_00000020 = *pdVar4;
      pSVar3 = SPxBasisBase<double>::Desc::colStatus
                         ((Desc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      *pSVar3 = D_UNDEFINED;
      if (*in_stack_00000020 - *in_stack_00000010 <= 0.0) {
        pdVar4 = (double *)infinity();
        local_120 = -*pdVar4;
      }
      else {
        pdVar4 = (double *)infinity();
        local_120 = *pdVar4;
      }
      *in_stack_00000008 = local_120;
    }
    pSVar3 = SPxBasisBase<double>::Desc::colStatus
                       ((Desc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
    SPxOut::
    debug<soplex::SPxSolverBase<double>,_const_char_(&)[73],_int_&,_soplex::SPxBasisBase<double>::Desc::Status_&,_soplex::SPxBasisBase<double>::Desc::Status_&,_soplex::StableSum<double>_&,_0>
              (in_RDI,(char (*) [73])
                      "DENTER03 SPxSolverBase::getEnterVals() : col {}: {} -> {} objChange: {}\n",
               &local_34,(Status *)in_stack_00000018,pSVar3,in_stack_00000028);
  }
  else {
    SPxRowId::SPxRowId(&local_88,&local_8);
    local_34 = SPxLPBase<double>::number
                         (in_stack_fffffffffffffe30,
                          (SPxRowId *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28))
    ;
    pSVar3 = SPxBasisBase<double>::Desc::rowStatus
                       ((Desc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
    (in_stack_00000018->rowstat).thesize = *pSVar3;
    RVar2 = rep(in_RDI);
    if (RVar2 == ROW) {
      computePvec(in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
      dVar6 = computeTest(in_stack_fffffffffffffe38,(int)((ulong)in_stack_fffffffffffffe30 >> 0x20))
      ;
      *local_18 = dVar6;
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *pdVar4 = 0.0;
    }
    else {
      coTest(in_RDI);
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *local_18 = *pdVar4;
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *pdVar4 = 0.0;
    }
    switch((in_stack_00000018->rowstat).thesize) {
    case 1:
      pdVar4 = (double *)infinity();
      *local_20 = *pdVar4;
      pdVar4 = (double *)infinity();
      *local_28 = -*pdVar4;
      *local_30 = 0.0;
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *in_stack_00000010 = *pdVar4;
      pdVar4 = SPxLPBase<double>::rhs(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      *in_stack_00000020 = *pdVar4;
      if (*in_stack_00000010 < *in_stack_00000020 || *in_stack_00000010 == *in_stack_00000020) {
        pdVar4 = (double *)infinity();
        local_1a0 = -*pdVar4;
      }
      else {
        pdVar4 = (double *)infinity();
        local_1a0 = *pdVar4;
      }
      *in_stack_00000008 = local_1a0;
      pSVar3 = SPxBasisBase<double>::Desc::rowStatus
                         ((Desc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      *pSVar3 = P_FIXED;
      break;
    case 2:
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *local_20 = *pdVar4;
      pdVar4 = (double *)infinity();
      *local_28 = -*pdVar4;
      *local_30 = *local_20;
      pdVar4 = (double *)infinity();
      *in_stack_00000008 = -*pdVar4;
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *in_stack_00000010 = *pdVar4;
      pdVar4 = SPxLPBase<double>::lhs(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      *in_stack_00000020 = *pdVar4;
      StableSum<double>::operator-=
                ((StableSum<double> *)in_stack_fffffffffffffe30,
                 (double)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      pSVar3 = SPxBasisBase<double>::Desc::rowStatus
                         ((Desc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      *pSVar3 = P_ON_LOWER;
      break;
    case 4:
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *local_28 = *pdVar4;
      pdVar4 = (double *)infinity();
      *local_20 = *pdVar4;
      *local_30 = *local_28;
      pdVar4 = (double *)infinity();
      *in_stack_00000008 = *pdVar4;
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *in_stack_00000010 = *pdVar4;
      pdVar4 = SPxLPBase<double>::rhs(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      *in_stack_00000020 = *pdVar4;
      StableSum<double>::operator-=
                ((StableSum<double> *)in_stack_fffffffffffffe30,
                 (double)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      pSVar3 = SPxBasisBase<double>::Desc::rowStatus
                         ((Desc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      *pSVar3 = P_ON_UPPER;
      break;
    case 6:
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *in_stack_00000010 = *pdVar4;
      dVar6 = *in_stack_00000010;
      pdVar4 = SPxLPBase<double>::rhs(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      if (dVar6 < *pdVar4 || dVar6 == *pdVar4) {
        pdVar4 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffe30,
                            in_stack_fffffffffffffe2c);
        *local_20 = *pdVar4;
        *local_30 = *local_20;
        pdVar4 = (double *)infinity();
        *local_28 = -*pdVar4;
        pdVar4 = (double *)infinity();
        *in_stack_00000008 = -*pdVar4;
        pdVar4 = SPxLPBase<double>::lhs(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
        *in_stack_00000020 = *pdVar4;
        pSVar3 = SPxBasisBase<double>::Desc::rowStatus
                           ((Desc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
        *pSVar3 = P_ON_LOWER;
      }
      else {
        pdVar4 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffe30,
                            in_stack_fffffffffffffe2c);
        *local_28 = *pdVar4;
        *local_30 = *local_28;
        pdVar4 = (double *)infinity();
        *local_20 = *pdVar4;
        pdVar4 = (double *)infinity();
        *in_stack_00000008 = *pdVar4;
        pdVar4 = SPxLPBase<double>::rhs(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
        *in_stack_00000020 = *pdVar4;
        pSVar3 = SPxBasisBase<double>::Desc::rowStatus
                           ((Desc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
        *pSVar3 = P_ON_UPPER;
      }
      VectorBase<double>::operator[]
                ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      SPxLPBase<double>::rhs(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      StableSum<double>::operator-=
                ((StableSum<double> *)in_stack_fffffffffffffe30,
                 (double)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      VectorBase<double>::operator[]
                ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      SPxLPBase<double>::lhs(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      StableSum<double>::operator-=
                ((StableSum<double> *)in_stack_fffffffffffffe30,
                 (double)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      break;
    case -4:
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *local_20 = *pdVar4;
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *local_28 = *pdVar4;
      *local_30 = *local_20;
      *in_stack_00000008 = *local_28 - *local_20;
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *in_stack_00000010 = *pdVar4;
      pdVar4 = SPxLPBase<double>::maxRowObj(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      *in_stack_00000020 = *pdVar4;
      StableSum<double>::operator-=
                ((StableSum<double> *)in_stack_fffffffffffffe30,
                 (double)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      dVar6 = *local_28;
      pdVar4 = (double *)infinity();
      if (-*pdVar4 < dVar6) {
        epsilon((SPxSolverBase<double> *)0x2595cc);
        bVar1 = EQ<double,double,double>
                          ((double)in_stack_fffffffffffffe30,
                           (double)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                           1.21698249883616e-317);
        if (bVar1) {
          pSVar3 = SPxBasisBase<double>::Desc::rowStatus
                             ((Desc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
          *pSVar3 = D_FREE;
        }
        else {
          pSVar3 = SPxBasisBase<double>::Desc::rowStatus
                             ((Desc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
          *pSVar3 = D_ON_BOTH;
        }
      }
      else {
        pSVar3 = SPxBasisBase<double>::Desc::rowStatus
                           ((Desc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
        *pSVar3 = D_ON_UPPER;
      }
      break;
    default:
      uVar5 = __cxa_allocate_exception(0x28);
      paVar7 = &local_d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,"XENTER03 This should never happen.",paVar7);
      SPxInternalCodeException::SPxInternalCodeException
                ((SPxInternalCodeException *)in_stack_fffffffffffffe30,
                 (string *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      __cxa_throw(uVar5,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    case -2:
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *local_20 = *pdVar4;
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *local_28 = *pdVar4;
      *local_30 = *local_28;
      *in_stack_00000008 = *local_20 - *local_28;
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
      ;
      *in_stack_00000010 = *pdVar4;
      pdVar4 = SPxLPBase<double>::maxRowObj(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      *in_stack_00000020 = *pdVar4;
      StableSum<double>::operator-=
                ((StableSum<double> *)in_stack_fffffffffffffe30,
                 (double)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      dVar6 = *local_20;
      pdVar4 = (double *)infinity();
      if (dVar6 < *pdVar4) {
        epsilon((SPxSolverBase<double> *)0x2593de);
        bVar1 = EQ<double,double,double>
                          ((double)in_stack_fffffffffffffe30,
                           (double)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                           1.21673843040711e-317);
        if (bVar1) {
          pSVar3 = SPxBasisBase<double>::Desc::rowStatus
                             ((Desc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
          *pSVar3 = D_FREE;
        }
        else {
          pSVar3 = SPxBasisBase<double>::Desc::rowStatus
                             ((Desc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
          *pSVar3 = D_ON_BOTH;
        }
      }
      else {
        pSVar3 = SPxBasisBase<double>::Desc::rowStatus
                           ((Desc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
        *pSVar3 = D_ON_LOWER;
      }
      break;
    case -1:
      local_aa = 1;
      uVar5 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"XENTER02 This should never happen.",&local_a9);
      SPxInternalCodeException::SPxInternalCodeException
                ((SPxInternalCodeException *)in_stack_fffffffffffffe30,
                 (string *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      local_aa = 0;
      __cxa_throw(uVar5,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    }
    pSVar3 = SPxBasisBase<double>::Desc::rowStatus(in_stack_00000018,in_stack_fffffffffffffe2c);
    SPxOut::
    debug<soplex::SPxSolverBase<double>,_const_char_(&)[73],_int_&,_soplex::SPxBasisBase<double>::Desc::Status_&,_soplex::SPxBasisBase<double>::Desc::Status_&,_soplex::StableSum<double>_&,_0>
              (in_RDI,(char (*) [73])
                      "DENTER05 SPxSolverBase::getEnterVals() : row {}: {} -> {} objChange: {}\n",
               &local_34,(Status *)in_stack_00000018,pSVar3,in_stack_00000028);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::getEnterVals
(
   SPxId enterId,
   R& enterTest,
   R& enterUB,
   R& enterLB,
   R& enterVal,
   R& enterMax,
   R& enterPric,
   typename SPxBasisBase<R>::Desc::Status& enterStat,
   R& enterRO,
   StableSum<R>& objChange
)
{
   int enterIdx;
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   if(enterId.isSPxColId())
   {
      enterIdx = this->number(SPxColId(enterId));
      enterStat = ds.colStatus(enterIdx);
      assert(!isBasic(enterStat));

      /*      For an #Id# to enter the basis we better recompute the Test value.
       */
      if(rep() == COLUMN)
      {
         computePvec(enterIdx);
         enterTest = computeTest(enterIdx);
         theTest[enterIdx] = 0;
      }
      else
      {
         enterTest = coTest()[enterIdx];
         theCoTest[enterIdx] = 0;
      }

      switch(enterStat)
      {
      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         enterUB = theUCbound[enterIdx];
         enterLB = theLCbound[enterIdx];
         enterVal = enterUB;
         enterMax = enterLB - enterUB;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->maxObj(enterIdx);
         objChange -= enterVal * enterRO;

         if(enterLB <= R(-infinity))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_LOWER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         enterUB = theUCbound[enterIdx];
         enterLB = theLCbound[enterIdx];
         enterVal = enterLB;
         enterMax = enterUB - enterLB;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->maxObj(enterIdx);
         objChange -= enterVal * enterRO;

         if(enterUB >= R(infinity))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_UPPER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
         enterUB = theUCbound[enterIdx];
         enterLB = theLCbound[enterIdx];
         enterVal = 0;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->maxObj(enterIdx);
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
         enterMax = (enterRO - enterPric > 0) ? R(infinity) : R(-infinity);
         break;

      // dual/rowwise cases:
      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         assert(theUCbound[enterIdx] < R(infinity));
         enterUB = theUCbound[enterIdx];
         enterLB = R(-infinity);
         enterMax = R(-infinity);
         enterVal = enterUB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = SPxLPBase<R>::lower(enterIdx);
         objChange -= enterRO * enterVal;
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         assert(theLCbound[enterIdx] > R(-infinity));
         enterLB = theLCbound[enterIdx];
         enterUB = R(infinity);
         enterMax = R(infinity);
         enterVal = enterLB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = SPxLPBase<R>::upper(enterIdx);
         objChange -= enterRO * enterVal;
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_FREE:
         assert(rep() == ROW);
         assert(SPxLPBase<R>::lower(enterIdx) == SPxLPBase<R>::upper(enterIdx));
         enterUB = R(infinity);
         enterLB = R(-infinity);
         enterVal = 0;
         enterRO = SPxLPBase<R>::upper(enterIdx);
         enterPric = (*theCoPvec)[enterIdx];

         if(enterPric > enterRO)
            enterMax = R(infinity);
         else
            enterMax = R(-infinity);

         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);
         enterPric = (*theCoPvec)[enterIdx];

         if(enterPric > SPxLPBase<R>::upper(enterIdx))
         {
            enterLB = theLCbound[enterIdx];
            enterUB = R(infinity);
            enterMax = R(infinity);
            enterVal = enterLB;
            enterRO = SPxLPBase<R>::upper(enterIdx);
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }
         else
         {
            enterUB = theUCbound[enterIdx];
            enterVal = enterUB;
            enterRO = SPxLPBase<R>::lower(enterIdx);
            enterLB = R(-infinity);
            enterMax = R(-infinity);
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }

         objChange -= theLCbound[enterIdx] * SPxLPBase<R>::upper(enterIdx);
         objChange -= theUCbound[enterIdx] * SPxLPBase<R>::lower(enterIdx);
         break;

      default:
         throw SPxInternalCodeException("XENTER01 This should never happen.");
      }

      SPxOut::debug(this, "DENTER03 SPxSolverBase::getEnterVals() : col {}: {} -> {} objChange: {}\n",
                    enterIdx, enterStat, ds.colStatus(enterIdx), objChange);
   }

   else
   {
      assert(enterId.isSPxRowId());
      enterIdx = this->number(SPxRowId(enterId));
      enterStat = ds.rowStatus(enterIdx);
      assert(!isBasic(enterStat));

      /*      For an #Id# to enter the basis we better recompute the Test value.
       */
      if(rep() == ROW)
      {
         computePvec(enterIdx);
         enterTest = computeTest(enterIdx);
         theTest[enterIdx] = 0;
      }
      else
      {
         enterTest = coTest()[enterIdx];
         theCoTest[enterIdx] = 0;
      }

      switch(enterStat)
      {
      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         enterUB = theURbound[enterIdx];
         enterLB = theLRbound[enterIdx];
         enterVal = enterLB;
         enterMax = enterUB - enterLB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = this->maxRowObj(enterIdx);
         objChange -= enterRO * enterVal;

         if(enterUB >= R(infinity))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_LOWER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         enterUB = theURbound[enterIdx];
         enterLB = theLRbound[enterIdx];
         enterVal = enterUB;
         enterMax = enterLB - enterUB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = this->maxRowObj(enterIdx);
         objChange -= enterRO * enterVal;

         if(enterLB <= R(-infinity))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_UPPER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
#if 1
         throw SPxInternalCodeException("XENTER02 This should never happen.");
#else
         SPX_MSG_ERROR(std::cerr << "EENTER99 ERROR: not yet debugged!" << std::endl;)
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = this->maxRowObj(enterIdx);
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
#endif
         break;

      // dual/rowwise cases:
      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         assert(theURbound[enterIdx] < R(infinity));
         enterUB = theURbound[enterIdx];
         enterLB = R(-infinity);
         enterVal = enterUB;
         enterMax = R(-infinity);
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->lhs(enterIdx);
         objChange -= enterRO * enterVal;
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         assert(theLRbound[enterIdx] > R(-infinity));
         enterLB = theLRbound[enterIdx];
         enterUB = R(infinity);
         enterVal = enterLB;
         enterMax = R(infinity);
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->rhs(enterIdx);
         objChange -= enterRO * enterVal;
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_FREE:
         assert(rep() == ROW);
         assert(this->rhs(enterIdx) == this->lhs(enterIdx));
         enterUB = R(infinity);
         enterLB = R(-infinity);
         enterVal = 0;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->rhs(enterIdx);
         enterMax = (enterPric > enterRO) ? R(infinity) : R(-infinity);
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);
         enterPric = (*thePvec)[enterIdx];

         if(enterPric > this->rhs(enterIdx))
         {
            enterLB = theLRbound[enterIdx];
            enterVal = enterLB;
            enterUB = R(infinity);
            enterMax = R(infinity);
            enterRO = this->rhs(enterIdx);
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }
         else
         {
            enterUB = theURbound[enterIdx];
            enterVal = enterUB;
            enterLB = R(-infinity);
            enterMax = R(-infinity);
            enterRO = this->lhs(enterIdx);
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }

         objChange -= theLRbound[enterIdx] * this->rhs(enterIdx);
         objChange -= theURbound[enterIdx] * this->lhs(enterIdx);
         break;

      default:
         throw SPxInternalCodeException("XENTER03 This should never happen.");
      }

      SPxOut::debug(this, "DENTER05 SPxSolverBase::getEnterVals() : row {}: {} -> {} objChange: {}\n",
                    enterIdx, enterStat, ds.rowStatus(enterIdx), objChange);
   }
}